

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svo_bitset.hh
# Opt level: O2

SVOBitset * __thiscall gss::innards::SVOBitset::operator&=(SVOBitset *this,SVOBitset *other)

{
  uint uVar1;
  uint i_1;
  long lVar2;
  uint i;
  ulong uVar3;
  
  uVar1 = this->n_words;
  if ((ulong)uVar1 < 0x11) {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      (this->_data).short_data[lVar2] =
           (this->_data).short_data[lVar2] & (other->_data).short_data[lVar2];
    }
  }
  else {
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      (this->_data).long_data[uVar3] =
           (this->_data).long_data[uVar3] & (other->_data).long_data[uVar3];
    }
  }
  return this;
}

Assistant:

constexpr auto _is_long() const -> bool
        {
            return n_words > svo_size;
        }